

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.H
# Opt level: O0

void __thiscall String::setValue(String *this,string *s)

{
  ulong uVar1;
  char *pcVar2;
  string *s_local;
  String *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if (((uVar1 & 1) == 0) && (pcVar2 = (char *)std::__cxx11::string::at((ulong)s), *pcVar2 == '@')) {
    std::__cxx11::string::assign((string *)this);
    this->_list = true;
  }
  else {
    uVar1 = std::__cxx11::string::empty();
    if (((uVar1 & 1) == 0) && (pcVar2 = (char *)std::__cxx11::string::at((ulong)s), *pcVar2 == '!'))
    {
      std::__cxx11::string::assign((string *)this,(ulong)s,1);
      this->_no = true;
    }
    else {
      std::__cxx11::string::assign((string *)this);
    }
  }
  return;
}

Assistant:

inline void setValue(std::string const & s)
    {
        if (!s.empty() && '@' == s.at(0)) {
            std::string::assign(s);
            _list = true;
        }
        else if (!s.empty() && '!' == s.at(0))
        {
            std::string::assign(s, 1, std::string::npos);
            _no = true;
        }
        else
        {
            std::string::assign(s);
        }
    }